

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

void Sbd_ManMergeTest(Sbd_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj;
  int local_14;
  int Node;
  Sbd_Man_t *p_local;
  
  for (local_14 = 0; local_14 < p->pGia->nObjs; local_14 = local_14 + 1) {
    pObj = Gia_ManObj(p->pGia,local_14);
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      Sbd_ManMergeCuts(p,local_14);
    }
  }
  uVar2 = Sbd_ManDelay(p);
  printf("Delay %d.\n",(ulong)uVar2);
  return;
}

Assistant:

void Sbd_ManMergeTest( Sbd_Man_t * p )
{
    int Node;
    Gia_ManForEachAndId( p->pGia, Node )
        Sbd_ManMergeCuts( p, Node );
    printf( "Delay %d.\n", Sbd_ManDelay(p) );
}